

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

size_t caption_frame_to_text(caption_frame_t *frame,utf8_char_t *data)

{
  utf8_char_t *c;
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  utf8_char_t *puVar6;
  size_t sVar7;
  int local_3c;
  
  *data = '\0';
  puVar6 = (frame->front).cell[0][0].data;
  lVar3 = 0;
  sVar7 = 0;
  iVar4 = 0;
  local_3c = 0;
  do {
    local_3c = local_3c + iVar4;
    lVar5 = 0;
    iVar4 = 0;
    do {
      c = puVar6 + lVar5;
      sVar2 = utf8_char_length(c);
      if (sVar2 != 0) {
        if (iVar4 < 1) {
          iVar1 = utf8_char_whitespace(c);
          if (iVar1 != 0) goto LAB_001056f1;
        }
        if (0 < local_3c) {
          data[2] = '\0';
          data[0] = '\r';
          data[1] = '\n';
          data = data + 2;
          sVar7 = sVar7 + 2;
          local_3c = 0;
        }
        sVar2 = utf8_char_copy(data,c);
        data = data + sVar2;
        sVar7 = sVar7 + sVar2;
        iVar4 = iVar4 + 1;
      }
LAB_001056f1:
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x100);
    lVar3 = lVar3 + 1;
    puVar6 = puVar6 + 0x100;
    if (lVar3 == 0xf) {
      return sVar7;
    }
  } while( true );
}

Assistant:

size_t caption_frame_to_text(caption_frame_t* frame, utf8_char_t* data)
{
    int r, c, uln, crlf = 0, count = 0;
    size_t s, size = 0;
    eia608_style_t sty;
    (*data) = '\0';

    for (r = 0; r < SCREEN_ROWS; ++r) {
        crlf += count, count = 0;
        for (c = 0; c < SCREEN_COLS; ++c) {
            const utf8_char_t* chr = caption_frame_read_char(frame, r, c, &sty, &uln);
            // dont start a new line until we encounter at least one printable character
            if (0 < utf8_char_length(chr) && (0 < count || !utf8_char_whitespace(chr))) {
                if (0 < crlf) {
                    memcpy(data, "\r\n\0", 3);
                    data += 2, size += 2, crlf = 0;
                }

                s = utf8_char_copy(data, chr);
                data += s, size += s, ++count;
            }
        }
    }

    return size;
}